

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMEntityReferenceImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMEntityReferenceImpl::DOMEntityReferenceImpl
          (DOMEntityReferenceImpl *this,DOMDocument *ownerDoc,XMLCh *entityName)

{
  code *pcVar1;
  short *psVar2;
  DOMDocument *pDVar3;
  int iVar4;
  ulong uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar7;
  undefined4 extraout_var_02;
  long *plVar8;
  XMLCh *pXVar9;
  DOMNode *pDVar10;
  _func_int **pp_Var11;
  XMLCh XVar12;
  _func_int **pp_Var13;
  _func_int *p_Var14;
  _func_int *p_Var6;
  
  (this->super_DOMEntityReference).super_DOMNode._vptr_DOMNode =
       (_func_int **)&PTR__DOMEntityReferenceImpl_00410e30;
  (this->super_HasDOMNodeImpl)._vptr_HasDOMNodeImpl =
       (_func_int **)&PTR__DOMEntityReferenceImpl_00410fb8;
  (this->super_HasDOMParentImpl)._vptr_HasDOMParentImpl =
       (_func_int **)&PTR__DOMEntityReferenceImpl_00410fe8;
  (this->super_HasDOMChildImpl)._vptr_HasDOMChildImpl =
       (_func_int **)&PTR__DOMEntityReferenceImpl_00411018;
  pDVar10 = &ownerDoc->super_DOMNode;
  if (ownerDoc == (DOMDocument *)0x0) {
    pDVar10 = (DOMNode *)0x0;
  }
  DOMNodeImpl::DOMNodeImpl(&this->fNode,(DOMNode *)this,pDVar10);
  DOMParentNode::DOMParentNode(&this->fParent,(DOMNode *)this,ownerDoc);
  DOMChildNode::DOMChildNode(&this->fChild);
  this->fBaseURI = (XMLCh *)0x0;
  if (entityName == (XMLCh *)0x0) {
    pp_Var13 = (_func_int **)0x0;
  }
  else {
    pDVar3 = (this->fParent).fOwnerDocument;
    lVar7 = 0;
    do {
      psVar2 = (short *)((long)entityName + lVar7);
      lVar7 = lVar7 + 2;
    } while (*psVar2 != 0);
    uVar5 = (ulong)(ushort)*entityName;
    if (uVar5 == 0) {
      uVar5 = 0;
    }
    else {
      XVar12 = entityName[1];
      if (XVar12 != L'\0') {
        pXVar9 = entityName + 2;
        do {
          uVar5 = (ulong)(ushort)XVar12 + (uVar5 >> 0x18) + uVar5 * 0x26;
          XVar12 = *pXVar9;
          pXVar9 = pXVar9 + 1;
        } while (XVar12 != L'\0');
      }
      uVar5 = uVar5 % (ulong)pDVar3[9].super_DOMNode._vptr_DOMNode;
    }
    p_Var14 = (_func_int *)((lVar7 >> 1) + -1);
    pp_Var11 = pDVar3[9].super_DOMDocumentTraversal._vptr_DOMDocumentTraversal;
    pp_Var13 = (_func_int **)pp_Var11[uVar5];
    if (pp_Var13 == (_func_int **)0x0) {
      pp_Var11 = pp_Var11 + uVar5;
    }
    else {
      do {
        pp_Var11 = pp_Var13;
        if (pp_Var11[1] == p_Var14) {
          pp_Var13 = pp_Var11 + 2;
          if (pp_Var13 == (_func_int **)entityName) goto LAB_00275b0c;
          lVar7 = 0;
          do {
            pcVar1 = (code *)((long)pp_Var13 + lVar7);
            if (*(short *)pcVar1 == 0) {
              if (*(short *)((long)entityName + lVar7) == 0) goto LAB_00275b0c;
              break;
            }
            psVar2 = (short *)((long)entityName + lVar7);
            lVar7 = lVar7 + 2;
          } while (*(short *)pcVar1 == *psVar2);
        }
        pp_Var13 = (_func_int **)*pp_Var11;
      } while ((_func_int **)*pp_Var11 != (_func_int **)0x0);
    }
    iVar4 = (*pDVar3[-1].super_DOMNode._vptr_DOMNode[4])
                      (&pDVar3[-1].super_DOMNode,(long)p_Var14 * 2 + 0x18);
    p_Var6 = (_func_int *)CONCAT44(extraout_var,iVar4);
    *pp_Var11 = p_Var6;
    *(_func_int **)(p_Var6 + 8) = p_Var14;
    *(undefined8 *)p_Var6 = 0;
    pp_Var13 = (_func_int **)(p_Var6 + 0x10);
    XMLString::copyString((XMLCh *)pp_Var13,entityName);
  }
LAB_00275b0c:
  this->fName = (XMLCh *)pp_Var13;
  if ((ownerDoc != (DOMDocument *)0x0) &&
     (iVar4 = (*(ownerDoc->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])(ownerDoc),
     CONCAT44(extraout_var_00,iVar4) != 0)) {
    iVar4 = (*(ownerDoc->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])(ownerDoc);
    lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x148))
                      ((long *)CONCAT44(extraout_var_01,iVar4));
    if (lVar7 != 0) {
      iVar4 = (*(ownerDoc->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])(ownerDoc);
      plVar8 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x148))
                                 ((long *)CONCAT44(extraout_var_02,iVar4));
      plVar8 = (long *)(**(code **)(*plVar8 + 0x20))(plVar8,entityName);
      if (plVar8 != (long *)0x0) {
        pXVar9 = (XMLCh *)(**(code **)(*plVar8 + 0xf8))(plVar8);
        this->fBaseURI = pXVar9;
        pDVar10 = (DOMNode *)(**(code **)(*plVar8 + 0x1b0))(plVar8);
        if (pDVar10 != (DOMNode *)0x0) {
          DOMParentNode::cloneChildren(&this->fParent,pDVar10);
        }
      }
    }
  }
  DOMNodeImpl::setReadOnly(&this->fNode,true,true);
  return;
}

Assistant:

DOMEntityReferenceImpl::DOMEntityReferenceImpl(DOMDocument *ownerDoc,
                                         const XMLCh *entityName)
    : fNode(this, ownerDoc), fParent(this, ownerDoc), fBaseURI(0)
{
    fName = ((DOMDocumentImpl*)fParent.fOwnerDocument)->getPooledString(entityName);
    // EntityReference behaves as a read-only node, since its contents
    // reflect the Entity it refers to -- but see setNodeName().
    //retrieve the corresponding entity content

    if (ownerDoc) {
        if (ownerDoc->getDoctype()) {
            if (ownerDoc->getDoctype()->getEntities()) {
                DOMEntityImpl* entity = (DOMEntityImpl*)ownerDoc->getDoctype()->getEntities()->getNamedItem(entityName);
                if (entity) {
                    fBaseURI = entity->getBaseURI();
                    DOMEntityReference* refEntity = entity->getEntityRef();
                    if (refEntity) {
                        fParent.cloneChildren(refEntity);
                    }
                }
            }
        }
    }

    fNode.setReadOnly(true, true);
}